

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O2

void __thiscall curlpp::internal::CurlHandle::CurlHandle(CurlHandle *this,CURL *handle)

{
  this->_vptr_CurlHandle = (_func_int **)&PTR__CurlHandle_00134c50;
  memset(this->mErrorBuffer,0,0x101);
  (this->mWriteFunctor).mImpl._M_ptr =
       (FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
        *)0x0;
  (this->mHeaderFunctor).mImpl._M_ptr =
       (FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
        *)0x0;
  (this->mReadFunctor).mImpl._M_ptr =
       (FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
        *)0x0;
  (this->mProgressFunctor).mImpl._M_ptr =
       (FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
        *)0x0;
  (this->mDebugFunctor).mImpl._M_ptr =
       (FunctorImpl<int,_utilspp::tl::TypeList<curl_infotype,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
        *)0x0;
  (this->mSslFunctor).mImpl._M_ptr =
       (FunctorImpl<CURLcode,_utilspp::tl::TypeList<void_*,_utilspp::NullType>_> *)0x0;
  this->mException = (CallbackExceptionBase *)0x0;
  this->mCurl = handle;
  runtimeAssert("Error when trying to curl_easy_init() a handle",handle != (CURL *)0x0);
  errorBuffer(this,this->mErrorBuffer);
  return;
}

Assistant:

CurlHandle::CurlHandle(CURL * handle) 
	: mException(NULL)
{
	memset(mErrorBuffer,0,CURL_ERROR_SIZE + 1);
	mCurl = handle;
	runtimeAssert("Error when trying to curl_easy_init() a handle", mCurl != NULL);
	errorBuffer(mErrorBuffer);
}